

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckHTMLAccess(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  AttVal *av_00;
  AttVal *av;
  Bool ValidLang;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  BVar2 = Level3_Enabled(doc);
  if (BVar2 != no) {
    av_00 = prvTidyAttrGetById(node,TidyAttr_LANG);
    if (av_00 != (AttVal *)0x0) {
      bVar1 = true;
      BVar2 = hasValue(av_00);
      if (BVar2 == no) {
        prvTidyReportAccessError(doc,node,0x2c1);
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,node,0x2c0);
    }
  }
  return;
}

Assistant:

static void CheckHTMLAccess( TidyDocImpl* doc, Node* node )
{
    Bool ValidLang = no;

    if (Level3_Enabled( doc ))
    {
        AttVal* av = attrGetLANG( node );
        if ( av )
        {
            ValidLang = yes;
            if ( !hasValue(av) )
                TY_(ReportAccessError)( doc, node, LANGUAGE_INVALID );
        }
        if ( !ValidLang )
            TY_(ReportAccessError)( doc, node, LANGUAGE_NOT_IDENTIFIED );
    }
}